

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_host_buffer.cpp
# Opt level: O0

shared_host_buffer * __thiscall
gpu::shared_host_buffer::operator=(shared_host_buffer *this,shared_host_buffer *other)

{
  shared_host_buffer *other_local;
  shared_host_buffer *this_local;
  
  if (this != other) {
    decref(this);
    this->buffer_ = other->buffer_;
    this->data_ = other->data_;
    this->type_ = other->type_;
    this->size_ = other->size_;
    incref(this);
  }
  return this;
}

Assistant:

shared_host_buffer &shared_host_buffer::operator= (const shared_host_buffer &other)
{
	if (this != &other) {
		decref();
		buffer_	= other.buffer_;
		data_	= other.data_;
		type_	= other.type_;
		size_	= other.size_;
		incref();
	}

	return *this;
}